

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void outlet_setstacklim(void)

{
  if (backtracer_stack != (t_msgstack *)0x0) {
    do {
      backtracer_stack = backtracer_stack->m_next;
    } while (backtracer_stack != (_msgstack *)0x0);
    backtracer_stack = (t_msgstack *)0x0;
  }
  freebytes((void *)0x0,0x70);
  stackcount = 0;
  outlet_eventno = outlet_eventno + 1;
  return;
}

Assistant:

void outlet_setstacklim(void)
{
    t_msgstack *m;
    while ((m = backtracer_stack))
        backtracer_stack = m->m_next; t_freebytes(m, sizeof (*m));
    stackcount = 0;
    outlet_eventno++;
}